

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O3

void __thiscall
Excel::Book::onCell(Book *this,size_t sheetIdx,size_t row,size_t column,wstring *value)

{
  ulong uVar1;
  pointer pwVar2;
  pointer pvVar3;
  Sheet *this_00;
  wstring *pwVar4;
  iterator it;
  pointer this_01;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = sheet(this,sheetIdx);
  pwVar2 = (value->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)local_50,pwVar2,pwVar2 + value->_M_string_length);
  this_01 = (this_00->m_cells).
            super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this_00->m_cells).
                     super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)this_01 >> 3) *
             -0x5555555555555555) < row + 1) {
    std::
    vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
    ::resize(&this_00->m_cells,row + 1);
    this_01 = (this_00->m_cells).
              super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar1 = column + 1;
  if ((ulong)(((long)this_01[row].super__Vector_base<Excel::Cell,_std::allocator<Excel::Cell>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)this_01[row].super__Vector_base<Excel::Cell,_std::allocator<Excel::Cell>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7) < uVar1) {
    if (this_00->m_columnsCount < uVar1) {
      this_00->m_columnsCount = uVar1;
      pvVar3 = (this_00->m_cells).
               super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (; this_01 != pvVar3; this_01 = this_01 + 1) {
        std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::resize
                  (this_01,this_00->m_columnsCount);
      }
    }
    else {
      std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::resize
                ((this_00->m_cells).
                 super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,this_00->m_columnsCount);
    }
  }
  pwVar4 = (wstring *)
           (column * 0x70 +
           *(long *)&(this_00->m_cells).
                     super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[row].
                     super__Vector_base<Excel::Cell,_std::allocator<Excel::Cell>_>._M_impl);
  std::__cxx11::wstring::_M_assign(pwVar4);
  pwVar4[0x68] = (wstring)0x0;
  *(undefined4 *)(pwVar4 + 0x6c) = 1;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] * 4 + 4);
  }
  return;
}

Assistant:

inline void
Book::onCell( size_t sheetIdx, size_t row, size_t column, const std::wstring & value )
{
	sheet( sheetIdx )->setCell( row, column, value );
}